

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::TextureStorage<2u,false>
          (StorageAndSubImageTest *this,GLenum target,GLuint texture,GLsizei levels,
          GLenum internalformat,GLsizei width,GLsizei height,GLsizei depth)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  bool bVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_1e0 [2];
  MessageBuilder local_1c0;
  int local_3c;
  long lStack_38;
  GLenum error;
  Functions *gl;
  GLenum local_28;
  GLsizei width_local;
  GLenum internalformat_local;
  GLsizei levels_local;
  GLuint texture_local;
  GLenum target_local;
  StorageAndSubImageTest *this_local;
  
  gl._4_4_ = width;
  local_28 = internalformat;
  width_local = levels;
  internalformat_local = texture;
  levels_local = target;
  _texture_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_38 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lStack_38 + 0x1450))(internalformat_local,width_local,local_28,gl._4_4_,height);
  local_3c = (**(code **)(lStack_38 + 0x800))();
  bVar4 = local_3c == 0;
  if (!bVar4) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1c0,(char (*) [49])"glTextureStorage2D unexpectedly generated error "
                       );
    EVar5 = glu::getErrorStr(local_3c);
    local_1e0[0].m_getName = EVar5.m_getName;
    local_1e0[0].m_value = EVar5.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1e0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [26])" during test with levels ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&width_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [19])", internal format ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_28);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])", width ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)((long)&gl + 4));
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [13])" and height ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&height);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    CleanTexture(this);
    CleanErrors(this);
  }
  return bVar4;
}

Assistant:

bool StorageAndSubImageTest::TextureStorage<2, false>(glw::GLenum target, glw::GLuint texture, glw::GLsizei levels,
													  glw::GLenum internalformat, glw::GLsizei width,
													  glw::GLsizei height, glw::GLsizei depth)
{
	(void)target;
	(void)depth;
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Preparing storage. */
	gl.textureStorage2D(texture, levels, internalformat, width, height);

	/* Error checking. */
	glw::GLenum error;

	if (GL_NO_ERROR != (error = gl.getError()))
	{
		/* Log. */
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glTextureStorage2D unexpectedly generated error " << glu::getErrorStr(error)
			<< " during test with levels " << levels << ", internal format " << internalformat << ", width " << width
			<< " and height " << height << "." << tcu::TestLog::EndMessage;

		CleanTexture();
		CleanErrors();

		return false;
	}

	return true;
}